

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::draw_sprites<(TI::TMS::SpriteMode)2,false>
          (Base<(TI::TMS::Personality)3> *this,uint8_t y,int start,int end,
          array<unsigned_int,_16UL> *palette,int *colour_buffer)

{
  uint8_t *puVar1;
  SpriteBuffer *pSVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  int sprite_buffer [256];
  uint auStack_438 [258];
  
  pSVar2 = this->draw_line_buffer_->sprites;
  if (pSVar2 != (SpriteBuffer *)0x0) {
    uVar7 = pSVar2->active_sprite_slot;
    uVar11 = (ulong)uVar7;
    if (uVar11 != 0) {
      bVar13 = this->sprites_magnified_;
      if ((start == 0) && (0 < (int)uVar7)) {
        lVar8 = 0;
        do {
          iVar6 = *(int *)(pSVar2->active_sprites[0].image + lVar8 + -4);
          if (iVar6 < 0) {
            puVar1 = pSVar2->active_sprites[0].image + lVar8 + 4;
            *(int *)puVar1 = *(int *)puVar1 - (iVar6 << ((bVar13 ^ 1U) & 0x1f));
          }
          lVar8 = lVar8 + 0x14;
        } while (uVar11 * 0x14 != lVar8);
      }
      lVar8 = (long)start;
      uVar12 = 0;
      memset(auStack_438 + lVar8,0,(long)(end - start) << 2);
      if ((int)uVar7 < 1) {
        bVar13 = true;
      }
      else {
        do {
          if (pSVar2->active_sprites[uVar11 - 1].shift_position < 0x10) {
            iVar6 = pSVar2->active_sprites[uVar11 - 1].x;
            iVar4 = start;
            if (start < iVar6) {
              iVar4 = iVar6;
            }
            if (iVar4 < end) {
              uVar7 = pSVar2->active_sprites[uVar11 - 1].shift_position;
              if (iVar6 <= start) {
                iVar6 = start;
              }
              lVar9 = 0;
              do {
                if (0xf < (int)uVar7) break;
                bVar5 = (byte)(uVar7 >> 1);
                uVar10 = (uint)(*(int *)pSVar2->active_sprites[uVar11 - 1].image << (bVar5 & 0x1f))
                         >> 7 & 1 |
                         ((uint)pSVar2->active_sprites[uVar11 - 1].image[1] << (bVar5 & 0x1f)) >> 6
                         & 2 | ((uint)pSVar2->active_sprites[uVar11 - 1].image[2] << (bVar5 & 0x1f))
                               >> 5 & 4 |
                               ((uint)pSVar2->active_sprites[uVar11 - 1].image[3] << (bVar5 & 0x1f))
                               >> 4 & 8;
                if (uVar10 != 0) {
                  uVar12 = uVar12 | auStack_438[iVar6 + lVar9];
                  auStack_438[iVar6 + lVar9] = uVar10 | 0x10;
                }
                uVar7 = uVar7 + (2 - (uint)bVar13);
                pSVar2->active_sprites[uVar11 - 1].shift_position = uVar7;
                lVar9 = lVar9 + 1;
              } while (end - iVar6 != (int)lVar9);
            }
          }
          bVar3 = 1 < (long)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar3);
        bVar13 = uVar12 == 0;
      }
      if (start < end) {
        do {
          if ((auStack_438[lVar8] != 0) &&
             (((byte)colour_buffer[lVar8] >> 5 & (colour_buffer[lVar8] & 0xfU) != 0) == 0)) {
            colour_buffer[lVar8] = auStack_438[lVar8];
          }
          lVar8 = lVar8 + 1;
        } while (end != lVar8);
      }
      if (!bVar13) {
        this->status_ = this->status_ | 0x20;
      }
    }
  }
  return;
}

Assistant:

void Base<personality>::draw_sprites([[maybe_unused]] uint8_t y, int start, int end, const std::array<uint32_t, 16> &palette, int *colour_buffer) {
	if(!draw_line_buffer_->sprites) {
		return;
	}

	auto &buffer = *draw_line_buffer_->sprites;
	if(!buffer.active_sprite_slot) {
		return;
	}

	const int shift_advance = sprites_magnified_ ? 1 : 2;

	// If this is the start of the line clip any part of any sprites that is off to the left.
	if(!start) {
		for(int index = 0; index < buffer.active_sprite_slot; ++index) {
			auto &sprite = buffer.active_sprites[index];
			if(sprite.x < 0) sprite.shift_position -= shift_advance * sprite.x;
		}
	}

	int sprite_buffer[256];
	int sprite_collision = 0;
	memset(&sprite_buffer[start], 0, size_t(end - start)*sizeof(sprite_buffer[0]));

	if constexpr (mode == SpriteMode::MasterSystem) {
		// Draw all sprites into the sprite buffer.
		for(int index = buffer.active_sprite_slot - 1; index >= 0; --index) {
			auto &sprite = buffer.active_sprites[index];
			if(sprite.shift_position >= 16) {
				continue;
			}

			const int pixel_start = std::max(start, sprite.x);

			// TODO: it feels like the work below should be simplifiable;
			// the double shift in particular, and hopefully the variable shift.
			for(int c = pixel_start; c < end && sprite.shift_position < 16; ++c) {
				const int shift = (sprite.shift_position >> 1);
				const int sprite_colour =
					(((sprite.image[3] << shift) & 0x80) >> 4) |
					(((sprite.image[2] << shift) & 0x80) >> 5) |
					(((sprite.image[1] << shift) & 0x80) >> 6) |
					(((sprite.image[0] << shift) & 0x80) >> 7);

				if(sprite_colour) {
					sprite_collision |= sprite_buffer[c];
					sprite_buffer[c] = sprite_colour | 0x10;
				}

				sprite.shift_position += shift_advance;
			}
		}

		// Draw the sprite buffer onto the colour buffer, wherever the tile map doesn't have
		// priority (or is transparent).
		for(int c = start; c < end; ++c) {
			if(
				sprite_buffer[c] &&
				(!(colour_buffer[c]&0x20) || !(colour_buffer[c]&0xf))
			) colour_buffer[c] = sprite_buffer[c];
		}

		if(sprite_collision) {
			status_ |= StatusSpriteCollision;
		}

		return;
	}

	if constexpr (SpriteBuffer::test_is_filling) {
		assert(!buffer.is_filling);
	}

	constexpr uint32_t sprite_colour_selection_masks[2] = {0x00000000, 0xffffffff};
	constexpr int colour_masks[16] = {0, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
	const int sprite_width = sprites_16x16_ ? 16 : 8;
	const int shifter_target = sprite_width << 1;
	const int pixel_width = sprites_magnified_ ? sprite_width << 1 : sprite_width;
	int min_sprite = 0;

	//
	// Approach taken for Mode 2 sprites:
	//
	//	(1)	precompute full sprite images, at up to 32 pixels wide;
	//	(2) for each sprite that is marked as CC, walk backwards until the
	//		first sprite that is not marked CC, ORing it into the precomputed
	//		image at each step;
	//	(3)	subsequently, just draw each sprite image independently.
	//
	if constexpr (mode == SpriteMode::Mode2) {
		// Determine the lowest visible sprite; exit early if that leaves no sprites visible.
		for(; min_sprite < buffer.active_sprite_slot; min_sprite++) {
			auto &sprite = buffer.active_sprites[min_sprite];
			if(sprite.opaque()) {
				break;
			}
		}
		if(min_sprite == buffer.active_sprite_slot) {
			return;
		}

		if(!start) {
			// Pre-rasterise the sprites one-by-one.
			if(sprites_magnified_) {
				for(int index = min_sprite; index < buffer.active_sprite_slot; index++) {
					auto &sprite = buffer.active_sprites[index];
					for(int c = 0; c < 32; c+= 2) {
						const int shift = (c >> 1) ^ 7;
						const int bit = 1 & (sprite.image[shift >> 3] >> (shift & 7));

						Storage<personality>::sprite_cache_[index][c] =
						Storage<personality>::sprite_cache_[index][c + 1] =
							(sprite.image[2] & 0xf & sprite_colour_selection_masks[bit]) |
							uint8_t((bit << StatusSpriteCollisionShift) & sprite.collision_bit());
					}
				}
			} else {
				for(int index = min_sprite; index < buffer.active_sprite_slot; index++) {
					auto &sprite = buffer.active_sprites[index];
					for(int c = 0; c < 16; c++) {
						const int shift = c ^ 7;
						const int bit = 1 & (sprite.image[shift >> 3] >> (shift & 7));

						Storage<personality>::sprite_cache_[index][c] =
							(sprite.image[2] & 0xf & sprite_colour_selection_masks[bit]) |
							uint8_t((bit << StatusSpriteCollisionShift) & sprite.collision_bit());
					}
				}
			}

			// Go backwards compositing any sprites that are set as OR masks onto their parents.
			for(int index = buffer.active_sprite_slot - 1; index >= min_sprite + 1; --index) {
				auto &sprite = buffer.active_sprites[index];
				if(sprite.opaque()) {
					continue;
				}

				// Sprite may affect all previous up to and cindlugin the next one that is opaque.
				for(int previous_index = index - 1; previous_index >= min_sprite; --previous_index) {
					// Determine region of overlap (if any).
					auto &previous = buffer.active_sprites[previous_index];
					const int origin = sprite.x - previous.x;
					const int x1 = std::max(0, -origin);
					const int x2 = std::min(pixel_width - origin, pixel_width);

					// Composite sprites.
					for(int x = x1; x < x2; x++) {
						Storage<personality>::sprite_cache_[previous_index][x + origin]
							|= Storage<personality>::sprite_cache_[index][x];
					}

					// If a previous opaque sprite has been found, stop.
					if(previous.opaque()) {
						break;
					}
				}
			}
		}

		// Draw.
		for(int index = buffer.active_sprite_slot - 1; index >= min_sprite; --index) {
			auto &sprite = buffer.active_sprites[index];
			const int x1 = std::max(0, start - sprite.x);
			const int x2 = std::min(end - sprite.x, pixel_width);

			for(int x = x1; x < x2; x++) {
				const uint8_t colour = Storage<personality>::sprite_cache_[index][x];

				// Plot colour, if visible.
				if(colour) {
					pixel_origin_[sprite.x + x] = palette[colour & 0xf];
				}

				// TODO: is collision location recorded in mode 1?

				// Check for a new collision.
				if(!(status_ & StatusSpriteCollision)) {
					sprite_collision |= sprite_buffer[sprite.x + x];
					sprite_buffer[sprite.x + x] |= colour;
					status_ |= sprite_collision & StatusSpriteCollision;

					if(status_ & StatusSpriteCollision) {
						Storage<personality>::collision_location_[0] = uint16_t(x);
						Storage<personality>::collision_location_[1] = uint16_t(y);
					}
				}
			}
		}

		return;
	}

	if constexpr (mode == SpriteMode::Mode1) {
		for(int index = buffer.active_sprite_slot - 1; index >= min_sprite; --index) {
			auto &sprite = buffer.active_sprites[index];
			if(sprite.shift_position >= shifter_target) {
				continue;
			}

			const int pixel_start = std::max(start, sprite.x);
			for(int c = pixel_start; c < end && sprite.shift_position < shifter_target; ++c) {
				const int shift = (sprite.shift_position >> 1) ^ 7;
				int sprite_colour = (sprite.image[shift >> 3] >> (shift & 7)) & 1;

				// A colision is detected regardless of sprite colour ...
				sprite_collision |= sprite_buffer[c] & sprite_colour;
				sprite_buffer[c] |= sprite_colour;

				// ... but a sprite with the transparent colour won't actually be visible.
				sprite_colour &= colour_masks[sprite.image[2] & 0xf];

				pixel_origin_[c] =
					(pixel_origin_[c] & sprite_colour_selection_masks[sprite_colour^1]) |
					(palette[sprite.image[2] & 0xf] & sprite_colour_selection_masks[sprite_colour]);

				sprite.shift_position += shift_advance;
			}
		}

		status_ |= sprite_collision << StatusSpriteCollisionShift;
		return;
	}
}